

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

u32 __thiscall
irr::scene::CSceneManager::registerNodeForRendering
          (CSceneManager *this,ISceneNode *node,E_SCENE_NODE_RENDER_PASS pass)

{
  pointer ppIVar1;
  IVideoDriver *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  array<irr::scene::ISceneNode_*> *this_00;
  uint uVar6;
  array<irr::scene::CSceneManager::TransparentNodeEntry> *this_01;
  ISceneNode *node_local;
  TransparentNodeEntry e;
  
  node_local = node;
  if (pass == ESNRP_GUI) {
    iVar3 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
    if ((char)iVar3 != '\0') {
      return 0;
    }
    this_00 = &this->GuiNodeList;
  }
  else {
    if (pass != ESNRP_SKY_BOX) {
      if (pass == ESNRP_SOLID) {
        iVar3 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
        if ((char)iVar3 != '\0') {
          return 0;
        }
LAB_001e71d0:
        DefaultNodeEntry::DefaultNodeEntry((DefaultNodeEntry *)&e,node);
        core::array<irr::scene::CSceneManager::DefaultNodeEntry>::push_back
                  (&this->SolidNodeList,(DefaultNodeEntry *)&e);
        return 1;
      }
      if (pass == ESNRP_TRANSPARENT) {
        iVar3 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
        if ((char)iVar3 != '\0') {
          return 0;
        }
        this_01 = &this->TransparentNodeList;
      }
      else {
        if (pass == ESNRP_AUTOMATIC) {
          iVar3 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
          if ((char)iVar3 != '\0') {
            return 0;
          }
          uVar4 = (*node->_vptr_ISceneNode[0x16])(node);
          uVar6 = 0;
          while (uVar4 != uVar6) {
            pIVar2 = this->Driver;
            iVar3 = (*node->_vptr_ISceneNode[0x15])(node,(ulong)uVar6);
            iVar3 = (*pIVar2->_vptr_IVideoDriver[0x67])(pIVar2,CONCAT44(extraout_var,iVar3));
            uVar6 = uVar6 + 1;
            if ((char)iVar3 != '\0') {
              TransparentNodeEntry::TransparentNodeEntry(&e,node,&this->camWorldPos);
              core::array<irr::scene::CSceneManager::TransparentNodeEntry>::push_back
                        (&this->TransparentNodeList,&e);
              return 1;
            }
          }
          goto LAB_001e71d0;
        }
        if (pass != ESNRP_TRANSPARENT_EFFECT) {
          if (pass != ESNRP_CAMERA) {
            return 0;
          }
          this_00 = &this->CameraList;
          ppIVar1 = (this->CameraList).m_data.
                    super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = 0;
          while ((uint)((ulong)((long)(this->CameraList).m_data.
                                      super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >>
                       3) != uVar4) {
            uVar5 = (ulong)uVar4;
            uVar4 = uVar4 + 1;
            if (ppIVar1[uVar5] == node) {
              return 0;
            }
          }
          goto LAB_001e720a;
        }
        iVar3 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
        if ((char)iVar3 != '\0') {
          return 0;
        }
        this_01 = &this->TransparentEffectNodeList;
      }
      TransparentNodeEntry::TransparentNodeEntry(&e,node,&this->camWorldPos);
      core::array<irr::scene::CSceneManager::TransparentNodeEntry>::push_back(this_01,&e);
      return 1;
    }
    this_00 = &this->SkyBoxList;
  }
LAB_001e720a:
  core::array<irr::scene::ISceneNode_*>::push_back(this_00,&node_local);
  return 1;
}

Assistant:

u32 CSceneManager::registerNodeForRendering(ISceneNode *node, E_SCENE_NODE_RENDER_PASS pass)
{
	u32 taken = 0;

	switch (pass) {
		// take camera if it is not already registered
	case ESNRP_CAMERA: {
		taken = 1;
		for (u32 i = 0; i != CameraList.size(); ++i) {
			if (CameraList[i] == node) {
				taken = 0;
				break;
			}
		}
		if (taken) {
			CameraList.push_back(node);
		}
	} break;
	case ESNRP_SKY_BOX:
		SkyBoxList.push_back(node);
		taken = 1;
		break;
	case ESNRP_SOLID:
		if (!isCulled(node)) {
			SolidNodeList.push_back(node);
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT:
		if (!isCulled(node)) {
			TransparentNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT_EFFECT:
		if (!isCulled(node)) {
			TransparentEffectNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_AUTOMATIC:
		if (!isCulled(node)) {
			const u32 count = node->getMaterialCount();

			taken = 0;
			for (u32 i = 0; i < count; ++i) {
				if (Driver->needsTransparentRenderPass(node->getMaterial(i))) {
					// register as transparent node
					TransparentNodeEntry e(node, camWorldPos);
					TransparentNodeList.push_back(e);
					taken = 1;
					break;
				}
			}

			// not transparent, register as solid
			if (!taken) {
				SolidNodeList.push_back(node);
				taken = 1;
			}
		}
		break;
	case ESNRP_GUI:
		if (!isCulled(node)) {
			GuiNodeList.push_back(node);
			taken = 1;
		}

	// as of yet unused
	case ESNRP_LIGHT:
	case ESNRP_SHADOW:
	case ESNRP_NONE: // ignore this one
		break;
	}

	return taken;
}